

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O1

int __thiscall libtorrent::aux::packet_buffer::remove(packet_buffer *this,char *__filename)

{
  int *piVar1;
  uint32_t uVar2;
  long lVar3;
  void *__ptr;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t in_EDX;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  if ((*(int *)(__filename + 8) + *(uint32_t *)(__filename + 0x10) <= in_EDX) ||
     (bVar4 = compare_less_wrap(in_EDX,*(uint32_t *)(__filename + 0x10),0xffff), bVar4)) {
    (this->m_storage).
    super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         = (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
            )0x0;
  }
  else {
    uVar11 = *(int *)(__filename + 8) - 1;
    uVar6 = (ulong)(uVar11 & in_EDX);
    lVar3 = *(long *)__filename;
    (this->m_storage).
    super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         = (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
           *(_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
             *)(lVar3 + uVar6 * 8);
    *(undefined8 *)(lVar3 + uVar6 * 8) = 0;
    __ptr = *(void **)(*(long *)__filename + uVar6 * 8);
    *(undefined8 *)(*(long *)__filename + uVar6 * 8) = 0;
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    if ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)
        (this->m_storage).
        super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
        ._M_t.
        super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
        .
        super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
        != (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
      piVar1 = (int *)(__filename + 0xc);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        *(undefined4 *)(__filename + 0x14) = *(undefined4 *)(__filename + 0x10);
      }
    }
    uVar2 = *(uint32_t *)(__filename + 0x10);
    if (*(int *)(__filename + 0xc) != 0 && uVar2 == in_EDX) {
      iVar8 = *(int *)(__filename + 8);
      uVar7 = uVar2 + 1;
      uVar5 = uVar7;
      if (iVar8 != 0) {
        iVar10 = uVar2 + iVar8;
        do {
          uVar5 = uVar7;
          if (*(long *)(*(long *)__filename + (ulong)(uVar7 & uVar11) * 8) != 0) break;
          uVar7 = uVar7 + 1;
          iVar8 = iVar8 + -1;
          uVar5 = iVar10 + 1;
        } while (iVar8 != 0);
      }
      *(uint *)(__filename + 0x10) = uVar5 & 0xffff;
    }
    uVar7 = *(uint *)(__filename + 0x14);
    if ((in_EDX + 1 & 0xffff) == uVar7 && *(int *)(__filename + 0xc) != 0) {
      iVar8 = *(int *)(__filename + 8);
      if (iVar8 != 0) {
        uVar9 = uVar7 - iVar8;
        uVar5 = uVar7;
        do {
          uVar7 = uVar5;
          if (*(long *)(*(long *)__filename + (ulong)(uVar5 - 1 & uVar11) * 8) != 0) break;
          iVar8 = iVar8 + -1;
          uVar5 = uVar5 - 1;
          uVar7 = uVar9;
        } while (iVar8 != 0);
      }
      *(uint *)(__filename + 0x14) = uVar7 & 0xffff;
    }
  }
  return (int)this;
}

Assistant:

packet_ptr packet_buffer::remove(index_type idx)
	{
		INVARIANT_CHECK;
		// TODO: use compare_less_wrap for this comparison as well
		if (idx >= m_first + m_capacity)
			return packet_ptr();

		if (compare_less_wrap(idx, m_first, 0xffff))
			return packet_ptr();

		std::size_t const mask = m_capacity - 1;
		packet_ptr old_value = std::move(m_storage[idx & mask]);
		m_storage[idx & mask].reset();

		if (old_value)
		{
			--m_size;
			if (m_size == 0) m_last = m_first;
		}

		if (idx == m_first && m_size != 0)
		{
			++m_first;
			for (index_type i = 0; i < m_capacity; ++i, ++m_first)
				if (m_storage[m_first & mask]) break;
			m_first &= 0xffff;
		}

		if (((idx + 1) & 0xffff) == m_last && m_size != 0)
		{
			--m_last;
			for (index_type i = 0; i < m_capacity; ++i, --m_last)
				if (m_storage[m_last & mask]) break;
			++m_last;
			m_last &= 0xffff;
		}

		TORRENT_ASSERT_VAL(m_first <= 0xffff, m_first);
		return old_value;
	}